

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O1

int mg_connect_ca(mg_session_params *params,mg_session **session,mg_allocator *allocator)

{
  sockaddr *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mg_session *session_00;
  char *pcVar5;
  addrinfo *paVar6;
  uint sockfd;
  int tsockfd;
  char portstr [6];
  addrinfo *addr_list;
  sockaddr peer_addr;
  char hostname [1025];
  uint local_48c;
  undefined8 local_488;
  mg_session **local_480;
  addrinfo *local_478 [6];
  sockaddr local_448;
  addrinfo local_438 [21];
  
  session_00 = mg_session_init(allocator);
  if (session_00 == (mg_session *)0x0) {
    return -3;
  }
  iVar3 = validate_session_params(params,session_00);
  if (iVar3 == 0) {
    local_478[0] = (addrinfo *)0x0;
    local_438[0].ai_flags = 0;
    local_438[0].ai_family = 0;
    local_438[0].ai_canonname = (char *)0x0;
    local_438[0].ai_next = (addrinfo *)0x0;
    local_438[0].ai_addrlen = 0;
    local_438[0]._20_4_ = 0;
    local_438[0].ai_addr = (sockaddr *)0x0;
    local_438[0].ai_socktype = 1;
    local_438[0].ai_protocol = 6;
    sprintf((char *)&local_488,"%u",(ulong)params->port);
    pcVar5 = params->host;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = params->address;
      if (pcVar5 == (char *)0x0) goto LAB_0010514c;
      local_438[0].ai_flags = 4;
    }
    iVar3 = getaddrinfo(pcVar5,(char *)&local_488,local_438,local_478);
    if (iVar3 == 0) {
      local_48c = 0xffffff9c;
      iVar3 = 0;
      local_480 = session;
      if (local_478[0] != (addrinfo *)0x0) {
        paVar6 = local_478[0];
        do {
          local_48c = mg_socket_create(paVar6->ai_family,paVar6->ai_socktype,paVar6->ai_protocol);
          iVar3 = mg_socket_create_handle_error(local_48c,session_00);
          if (iVar3 == 0) {
            iVar3 = mg_socket_connect(local_48c,(sockaddr *)paVar6->ai_addr,paVar6->ai_addrlen);
            iVar3 = mg_socket_connect_handle_error((int *)&local_48c,iVar3,session_00);
            if (iVar3 == 0) {
              psVar1 = paVar6->ai_addr;
              local_448.sa_family = psVar1->sa_family;
              local_448.sa_data[0] = psVar1->sa_data[0];
              local_448.sa_data[1] = psVar1->sa_data[1];
              local_448.sa_data[2] = psVar1->sa_data[2];
              local_448.sa_data[3] = psVar1->sa_data[3];
              local_448.sa_data[4] = psVar1->sa_data[4];
              local_448.sa_data[5] = psVar1->sa_data[5];
              local_448.sa_data._6_8_ = *(undefined8 *)(psVar1->sa_data + 6);
              iVar3 = 0;
              break;
            }
          }
          paVar6 = paVar6->ai_next;
        } while (paVar6 != (addrinfo *)0x0);
      }
      freeaddrinfo(local_478[0]);
      sockfd = 0xffffffff;
      session = local_480;
      if (local_48c != 0xffffff9c) {
        iVar3 = mg_socket_options(local_48c,session_00);
        sockfd = -(uint)(iVar3 != 0) | local_48c;
        session = local_480;
      }
    }
    else {
      pcVar5 = gai_strerror(iVar3);
      mg_session_set_error(session_00,"getaddrinfo failed: %s",pcVar5);
      iVar3 = -8;
      sockfd = 0xffffffff;
    }
    if (iVar3 == 0) {
      if (params->sslmode == MG_SSLMODE_REQUIRE) {
        iVar3 = mg_secure_transport_init
                          (sockfd,params->sslcert,params->sslkey,(mg_secure_transport **)&local_488,
                           allocator);
        if (iVar3 == 0) {
          session_00->transport = (mg_transport *)CONCAT44(local_488._4_4_,(uint)local_488);
          if (params->trust_callback ==
              (_func_int_char_ptr_char_ptr_char_ptr_char_ptr_void_ptr *)0x0) {
LAB_00104fac:
            iVar3 = 0;
            bVar2 = true;
          }
          else {
            iVar3 = get_hostname_and_ip(&local_448,(char *)local_438,(char *)local_478,session_00);
            if (iVar3 == 0) {
              iVar3 = (*params->trust_callback)
                                ((char *)local_438,(char *)local_478,
                                 *(char **)(CONCAT44(local_488._4_4_,(uint)local_488) + 0x38),
                                 *(char **)(CONCAT44(local_488._4_4_,(uint)local_488) + 0x40),
                                 params->trust_data);
              if (iVar3 == 0) goto LAB_00104fac;
              bVar2 = false;
              mg_session_set_error(session_00,"trust callback returned non-zero value");
              iVar3 = -0x12;
            }
            else {
              bVar2 = false;
            }
          }
        }
        else {
          bVar2 = false;
          mg_session_set_error(session_00,"failed to initialize secure connection");
        }
        if (!bVar2) goto LAB_00104ec7;
      }
      else {
        if (params->sslmode != MG_SSLMODE_DISABLE) goto LAB_0010514c;
        iVar3 = mg_raw_transport_init(sockfd,(mg_raw_transport **)&session_00->transport,allocator);
        if (iVar3 != 0) {
          mg_session_set_error(session_00,"failed to initialize connection");
          goto LAB_00104ec7;
        }
      }
      local_438[0]._0_8_ = local_438[0]._0_8_ & 0xffffffff00000000;
      local_478[0] = (addrinfo *)CONCAT44(local_478[0]._4_4_,0x1000000);
      local_488._0_4_ = 0x4010000;
      mg_transport_suspend_until_ready_to_write(session_00->transport);
      iVar3 = mg_transport_send(session_00->transport,MG_HANDSHAKE_MAGIC,4);
      if ((((iVar3 == 0) &&
           (iVar3 = mg_transport_send(session_00->transport,(char *)&local_488,4), iVar3 == 0)) &&
          (iVar3 = mg_transport_send(session_00->transport,(char *)local_478,4), iVar3 == 0)) &&
         ((iVar3 = mg_transport_send(session_00->transport,(char *)local_438,4), iVar3 == 0 &&
          (iVar3 = mg_transport_send(session_00->transport,(char *)local_438,4), iVar3 == 0)))) {
        mg_transport_suspend_until_ready_to_read(session_00->transport);
        iVar3 = mg_transport_recv(session_00->transport,(char *)&local_48c,4);
        if (iVar3 == 0) {
          if (local_48c == (uint)local_478[0]) {
            session_00->version = 1;
          }
          else {
            if (local_48c != (uint)local_488) {
              mg_session_set_error
                        (session_00,"unsupported protocol version: %u",
                         (ulong)(local_48c >> 0x18 | (local_48c & 0xff0000) >> 8 |
                                 (local_48c & 0xff00) << 8 | local_48c << 0x18));
              iVar3 = -10;
              goto LAB_001050a2;
            }
            session_00->version = 4;
          }
          iVar3 = 0;
        }
        else {
          mg_session_set_error(session_00,"failed to receive handshake response");
          iVar3 = -2;
        }
      }
      else {
        mg_session_set_error(session_00,"failed to send handshake data");
        iVar3 = -1;
      }
LAB_001050a2:
      if ((iVar3 == 0) && (iVar3 = mg_bolt_init(session_00,params), iVar3 == 0)) {
        session_00->status = 0;
        *session = session_00;
        return 0;
      }
      goto LAB_00104d5a;
    }
  }
  else {
LAB_00104d5a:
    sockfd = 0xffffffff;
  }
LAB_00104ec7:
  if (((int)sockfd < 0) || (iVar4 = mg_socket_close(sockfd), iVar4 == 0)) {
    *session = session_00;
    mg_session_invalidate(session_00);
    return iVar3;
  }
LAB_0010514c:
  abort();
}

Assistant:

int mg_connect_ca(const mg_session_params *params, mg_session **session,
                  mg_allocator *allocator) {
  // Useful read https://akkadia.org/drepper/userapi-ipv6.html.
  mg_session *tsession = mg_session_init(allocator);
  if (!tsession) {
    return MG_ERROR_OOM;
  }

  int status = 0;
  int sockfd = -1;

  status = validate_session_params(params, tsession);
  if (status != 0) {
    goto cleanup;
  }

  struct sockaddr peer_addr;
  status = init_tcp_connection(params, &sockfd, &peer_addr, tsession);
  if (status != 0) {
    goto cleanup;
  }
  switch (params->sslmode) {
    case MG_SSLMODE_DISABLE:
      status = mg_raw_transport_init(
          sockfd, (mg_raw_transport **)&tsession->transport, allocator);
      if (status != 0) {
        mg_session_set_error(tsession, "failed to initialize connection");
        goto cleanup;
      }
      break;
#ifndef __EMSCRIPTEN__
    case MG_SSLMODE_REQUIRE: {
      mg_secure_transport *ttransport;
      status = mg_secure_transport_init(sockfd, params->sslcert, params->sslkey,
                                        &ttransport, allocator);
      if (status != 0) {
        mg_session_set_error(tsession,
                             "failed to initialize secure connection");
        goto cleanup;
      }
      tsession->transport = (mg_transport *)ttransport;
      if (params->trust_callback) {
        char ip[INET6_ADDRSTRLEN];
        char hostname[NI_MAXHOST];
        status = get_hostname_and_ip(&peer_addr, hostname, ip, tsession);
        if (status != 0) {
          goto cleanup;
        }
        int trust_result = params->trust_callback(
            hostname, ip, ttransport->peer_pubkey_type,
            ttransport->peer_pubkey_fp, params->trust_data);
        if (trust_result != 0) {
          mg_session_set_error(tsession,
                               "trust callback returned non-zero value");
          status = MG_ERROR_TRUST_CALLBACK;
          goto cleanup;
        }
      }
      break;
    }
#endif
    default:
      // Should not get here.
      abort();
  }

  // mg_transport object took ownership of the socket.
  sockfd = -1;
  status = mg_bolt_handshake(tsession);
  if (status != 0) {
    goto cleanup;
  }
  status = mg_bolt_init(tsession, params);
  if (status != 0) {
    goto cleanup;
  }

  tsession->status = MG_SESSION_READY;
  *session = tsession;
  return 0;

cleanup:
  if (sockfd >= 0 && mg_socket_close(sockfd) != 0) {
    abort();
  }
  *session = tsession;
  mg_session_invalidate(tsession);
  return status;
}